

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O3

void VP8LCreateHuffmanTree
               (uint32_t *histogram,int tree_depth_limit,uint8_t *buf_rle,HuffmanTree *huff_tree,
               HuffmanTreeCode *huff_code)

{
  HuffmanTree *pHVar1;
  uint32_t *puVar2;
  byte bVar3;
  byte *bit_depths;
  uint8_t *puVar4;
  uint16_t *puVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  size_t sVar10;
  HuffmanTree *pool;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  uint32_t uVar17;
  HuffmanTree *pHVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  size_t __n;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  uint32_t next_code [16];
  undefined8 local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  uint local_78 [18];
  
  uVar25 = huff_code->num_symbols;
  __n = (size_t)(int)uVar25;
  memset(buf_rle,0,__n);
  if (((long)__n < 0) || (uVar20 = uVar25, uVar25 == 0)) {
LAB_0014352b:
    local_88 = (undefined1  [16])0x0;
    local_98 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    local_b8 = (undefined1  [16])0x0;
    iVar15 = huff_code->num_symbols;
    lVar13 = (long)iVar15;
    if (0 < lVar13) {
      puVar4 = huff_code->code_lengths;
      lVar19 = 0;
      do {
        *(int *)(local_b8 + (ulong)puVar4[lVar19] * 4) =
             *(int *)(local_b8 + (ulong)puVar4[lVar19] * 4) + 1;
        lVar19 = lVar19 + 1;
      } while (lVar13 != lVar19);
    }
    uVar25 = 0;
    auVar7._12_4_ = 0;
    auVar7._0_12_ = local_b8._4_12_;
    local_b8 = auVar7 << 0x20;
    local_78[0] = 0;
    lVar19 = 1;
    do {
      uVar25 = (uVar25 + *(int *)(local_b8 + lVar19 * 4 + -4)) * 2;
      local_78[lVar19] = uVar25;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x10);
    if (0 < iVar15) {
      puVar4 = huff_code->code_lengths;
      puVar5 = huff_code->codes;
      lVar19 = 0;
      do {
        bVar3 = puVar4[lVar19];
        uVar25 = local_78[bVar3];
        local_78[bVar3] = uVar25 + 1;
        uVar20 = 0;
        if (bVar3 != 0) {
          uVar22 = 0;
          bVar14 = 0xc;
          uVar20 = 0;
          do {
            uVar22 = uVar22 + 4;
            uVar20 = uVar20 | (uint)""[uVar25 & 0xf] << (bVar14 & 0x1f);
            uVar25 = uVar25 >> 4;
            bVar14 = bVar14 - 4;
          } while (uVar22 < bVar3);
        }
        puVar5[lVar19] = (uint16_t)(uVar20 >> (0x10 - bVar3 & 0x1f));
        lVar19 = lVar19 + 1;
      } while (lVar19 != lVar13);
    }
    return;
  }
  while (uVar23 = (ulong)uVar20, histogram[uVar23 - 1] == 0) {
    uVar20 = uVar20 - 1;
    if (uVar20 == 0) goto LAB_00143301;
  }
  uVar17 = *histogram;
  uVar26 = 0;
  uVar22 = 0;
  do {
    if ((uVar23 == uVar26) || (histogram[uVar26] != uVar17)) {
      if ((uVar17 == 0 && 4 < (int)uVar22) || (6 < (int)uVar22 && uVar17 != 0)) {
        memset(buf_rle + uVar26 + (-1 - (ulong)(uVar22 - 1)),1,(ulong)uVar22);
      }
      uVar22 = 1;
      if (uVar23 != uVar26) {
        uVar17 = histogram[uVar26];
      }
    }
    else {
      uVar22 = uVar22 + 1;
    }
    uVar26 = uVar26 + 1;
  } while (uVar20 + 1 != uVar26);
  uVar26 = (ulong)*histogram;
  uVar24 = 0;
  uVar17 = 0;
  uVar22 = 0;
  do {
    if (((uVar24 == uVar23) || (buf_rle[uVar24] != '\0')) ||
       ((uVar24 != 0 && (buf_rle[uVar24 - 1] != '\0')))) {
LAB_001436de:
      if ((3 < uVar22) || ((uVar22 == 3 && (uVar17 == 0)))) {
        uVar16 = (uVar22 >> 1) + uVar17;
        uVar21 = uVar16 / uVar22;
        if (uVar16 < uVar22) {
          uVar21 = 1;
        }
        if (uVar17 == 0) {
          uVar21 = 0;
        }
        lVar13 = -1;
        do {
          histogram[(uint)((int)uVar24 + (int)lVar13)] = uVar21;
          lVar19 = (ulong)uVar22 + lVar13;
          lVar13 = lVar13 + -1;
        } while (lVar19 != 0);
      }
      if ((long)uVar24 < (long)(int)(uVar20 - 3)) {
        puVar2 = histogram + uVar24;
        uVar26 = (ulong)(puVar2[3] + puVar2[1] + puVar2[2] + *puVar2 + 2 >> 2);
      }
      else {
        uVar26 = 0;
        if (uVar24 < uVar23) {
          uVar26 = (ulong)histogram[uVar24];
        }
      }
      uVar17 = 0;
      uVar22 = 1;
      if (uVar24 != uVar23) {
        uVar17 = histogram[uVar24];
      }
    }
    else {
      uVar16 = histogram[uVar24] - (int)uVar26;
      uVar21 = -uVar16;
      if (0 < (int)uVar16) {
        uVar21 = uVar16;
      }
      if (3 < uVar21) goto LAB_001436de;
      uVar22 = uVar22 + 1;
      uVar17 = histogram[uVar24] + uVar17;
      if (3 < uVar22) {
        uVar26 = (ulong)((uVar22 >> 1) + uVar17) / (ulong)uVar22;
      }
    }
    uVar24 = uVar24 + 1;
  } while (uVar24 != uVar20 + 1);
LAB_00143301:
  if (uVar25 != 0) {
    bit_depths = huff_code->code_lengths;
    sVar10 = 0;
    uVar20 = 0;
    do {
      uVar20 = (uVar20 + 1) - (uint)(histogram[sVar10] == 0);
      sVar10 = sVar10 + 1;
    } while (__n != sVar10);
    if (uVar20 != 0) {
      uVar23 = (ulong)uVar20;
      pool = huff_tree + uVar23;
      local_c0 = huff_tree + -1;
      uVar22 = 1;
      do {
        sVar10 = 0;
        iVar15 = 0;
        do {
          uVar21 = histogram[sVar10];
          if (uVar21 != 0) {
            if (uVar21 <= uVar22) {
              uVar21 = uVar22;
            }
            huff_tree[iVar15].total_count_ = uVar21;
            huff_tree[iVar15].value_ = (int)sVar10;
            huff_tree[iVar15].pool_index_left_ = -1;
            huff_tree[iVar15].pool_index_right_ = -1;
            iVar15 = iVar15 + 1;
          }
          sVar10 = sVar10 + 1;
        } while (__n != sVar10);
        qsort(huff_tree,uVar23,0x10,CompareHuffmanTrees);
        if (uVar20 == 1) {
          bit_depths[huff_tree->value_] = 1;
        }
        else {
          uVar26 = uVar23;
          uVar24 = 0;
          uVar28 = (ulong)(uVar20 - 2);
          do {
            uVar27 = uVar24 | 1;
            pHVar18 = local_c0 + uVar26;
            iVar15 = pHVar18->value_;
            iVar8 = pHVar18->pool_index_left_;
            iVar9 = pHVar18->pool_index_right_;
            pHVar1 = pool + uVar24;
            pHVar1->total_count_ = pHVar18->total_count_;
            pHVar1->value_ = iVar15;
            pHVar1->pool_index_left_ = iVar8;
            pHVar1->pool_index_right_ = iVar9;
            pHVar1 = huff_tree + (uVar26 - 2);
            iVar15 = pHVar1->value_;
            iVar8 = pHVar1->pool_index_left_;
            iVar9 = pHVar1->pool_index_right_;
            pHVar18 = pool + uVar27;
            pHVar18->total_count_ = pHVar1->total_count_;
            pHVar18->value_ = iVar15;
            pHVar18->pool_index_left_ = iVar8;
            pHVar18->pool_index_right_ = iVar9;
            uVar21 = pool[uVar24].total_count_ + pool[uVar27].total_count_;
            uVar12 = 0;
            if (2 < (long)uVar26) {
              uVar11 = 0;
              pHVar18 = huff_tree;
              do {
                uVar12 = uVar11;
                if (pHVar18->total_count_ <= uVar21) break;
                uVar11 = uVar11 + 1;
                pHVar18 = pHVar18 + 1;
                uVar12 = uVar28;
              } while (uVar28 != uVar11);
            }
            pHVar18 = huff_tree + (uVar12 & 0xffffffff);
            memmove(pHVar18 + 1,huff_tree + (uVar12 & 0xffffffff),
                    ((uVar26 - 2) - (long)(int)uVar12) * 0x10);
            pHVar18->total_count_ = uVar21;
            pHVar18->value_ = -1;
            pHVar18->pool_index_left_ = (int)uVar27;
            pHVar18->pool_index_right_ = (int)uVar24;
            uVar28 = uVar28 - 1;
            bVar6 = 2 < (long)uVar26;
            uVar26 = uVar26 - 1;
            uVar24 = uVar24 + 2;
          } while (bVar6);
          SetBitDepths(huff_tree,pool,bit_depths,0);
        }
        uVar21 = (uint)*bit_depths;
        if (uVar25 != 1) {
          sVar10 = 1;
          do {
            if (uVar21 <= bit_depths[sVar10]) {
              uVar21 = (uint)bit_depths[sVar10];
            }
            sVar10 = sVar10 + 1;
          } while (__n != sVar10);
        }
        uVar22 = uVar22 * 2;
      } while (tree_depth_limit < (int)uVar21);
    }
  }
  goto LAB_0014352b;
}

Assistant:

void VP8LCreateHuffmanTree(uint32_t* const histogram, int tree_depth_limit,
                           uint8_t* const buf_rle, HuffmanTree* const huff_tree,
                           HuffmanTreeCode* const huff_code) {
  const int num_symbols = huff_code->num_symbols;
  memset(buf_rle, 0, num_symbols * sizeof(*buf_rle));
  OptimizeHuffmanForRle(num_symbols, buf_rle, histogram);
  GenerateOptimalTree(histogram, num_symbols, huff_tree, tree_depth_limit,
                      huff_code->code_lengths);
  // Create the actual bit codes for the bit lengths.
  ConvertBitDepthsToSymbols(huff_code);
}